

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O2

void __thiscall
xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::
AddEdge(Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_> *this,
       StateExample sstate,StateExample dstate,double trans)

{
  vertex_iterator vVar1;
  edge_iterator eVar2;
  ostream *poVar3;
  vertex_iterator src_vertex;
  vertex_iterator dst_vertex;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  local_30;
  double local_28;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
  local_20;
  
  local_28 = trans;
  vVar1 = ObtainVertexFromVertexMap(this,sstate);
  local_30._M_cur = (__node_type *)vVar1;
  eVar2 = Vertex::FindEdge<xmotion::StateExample,_nullptr>
                    (*(Vertex **)
                      ((long)vVar1.super_const_vertex_iterator.super_VertexMapTypeIterator.
                             super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                             ._M_cur + 0x10),dstate);
  if (eVar2._M_node !=
      (_List_node_base *)
      (*(long *)((long)vVar1.super_const_vertex_iterator.super_VertexMapTypeIterator.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                       ._M_cur + 0x10) + 0x18)) {
    eVar2._M_node[2]._M_next = (_List_node_base *)trans;
    std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar3 = std::ostream::_M_insert<double>(trans);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  local_20._M_cur = (__node_type *)ObtainVertexFromVertexMap(this,dstate);
  std::__cxx11::
  list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
  ::push_back((list<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator,_std::allocator<xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::vertex_iterator>_>
               *)(*(long *)((long)local_20._M_cur + 0x10) + 0x30),(value_type *)&local_30);
  std::__cxx11::
  list<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge,std::allocator<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge>>
  ::
  emplace_back<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::vertex_iterator&,xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::vertex_iterator&,double&>
            ((list<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge,std::allocator<xmotion::Graph<xmotion::StateExample,double,xmotion::DefaultIndexer<xmotion::StateExample>>::Edge>>
              *)(*(long *)((long)&((local_30._M_cur)->
                                  super__Hash_node_value<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<xmotion::StateExample,_double,_xmotion::DefaultIndexer<xmotion::StateExample>_>::Vertex_*>_>
                                  ._M_storage._M_storage + 8) + 0x18),(vertex_iterator *)&local_30,
             (vertex_iterator *)&local_20,&local_28);
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}